

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O2

int jpc_bitstream_outalign(jpc_bitstream_t *bitstream,int filldata)

{
  uint_fast16_t uVar1;
  jas_stream_t *stream;
  uchar *puVar2;
  uchar uVar3;
  uint n;
  int iVar4;
  
  if ((bitstream->openmode_ & 2) == 0) {
    __assert_fail("bitstream->openmode_ & JPC_BITSTREAM_WRITE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,400,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
  if (0x3f < (uint)filldata) {
    __assert_fail("!(filldata & (~0x3f))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0x196,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
  n = bitstream->cnt_;
  if (n == 0) {
    if ((char)bitstream->buf_ != -1) goto LAB_00118f66;
    n = 7;
  }
  else {
    if (7 < n) {
      return 0;
    }
    filldata = (uint)filldata >> (7U - (char)n & 0x1f);
  }
  iVar4 = jpc_bitstream_putbits(bitstream,n,(ulong)(uint)filldata);
  if (iVar4 != 0) {
    return -1;
  }
  if (7 < bitstream->cnt_) {
    return 0;
  }
  if (bitstream->cnt_ < 0) {
    __assert_fail("bitstream->cnt_ >= 0 && bitstream->cnt_ < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0x1b0,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
LAB_00118f66:
  uVar1 = bitstream->buf_;
  uVar3 = (uchar)uVar1;
  if (uVar3 == 0xff) {
    __assert_fail("(bitstream->buf_ & 0xff) != 0xff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0x1b1,"int jpc_bitstream_outalign(jpc_bitstream_t *, int)");
  }
  stream = bitstream->stream_;
  if ((stream->flags_ & 7U) == 0) {
    if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
      stream->flags_ = stream->flags_ | 4;
      return -1;
    }
    *(byte *)&stream->bufmode_ = (byte)stream->bufmode_ | 0x20;
    iVar4 = stream->cnt_;
    stream->cnt_ = iVar4 + -1;
    if (iVar4 < 1) {
      iVar4 = jas_stream_flushbuf(stream,(uint)uVar1 & 0xff);
      if (iVar4 == -1) {
        return -1;
      }
    }
    else {
      stream->rwcnt_ = stream->rwcnt_ + 1;
      puVar2 = stream->ptr_;
      stream->ptr_ = puVar2 + 1;
      *puVar2 = uVar3;
    }
    bitstream->cnt_ = 8;
    bitstream->buf_ = (ulong)(((uint)bitstream->buf_ & 0xff) << 8);
    return 0;
  }
  return -1;
}

Assistant:

int jpc_bitstream_outalign(jpc_bitstream_t *bitstream, int filldata)
{
	int n;
	int v;

	/* Ensure that this bit stream is open for writing. */
	assert(bitstream->openmode_ & JPC_BITSTREAM_WRITE);

	/* Ensure that the first bit of fill data is zero. */
	/* Note: The first bit of fill data must be zero.  If this were not
	  the case, the fill data itself could cause further bit stuffing to
	  be required (which would cause numerous complications). */
	assert(!(filldata & (~0x3f)));

	if (!bitstream->cnt_) {
		if ((bitstream->buf_ & 0xff) == 0xff) {
			n = 7;
			v = filldata;
		} else {
			n = 0;
			v = 0;
		}
	} else if (bitstream->cnt_ > 0 && bitstream->cnt_ < 8) {
		n = bitstream->cnt_;
		v = filldata >> (7 - n);
	} else {
		n = 0;
		v = 0;
		return 0;
	}

	/* Write the appropriate fill data to the bit stream. */
	if (n > 0) {
		if (jpc_bitstream_putbits(bitstream, n, v)) {
			return -1;
		}
	}
	if (bitstream->cnt_ < 8) {
		assert(bitstream->cnt_ >= 0 && bitstream->cnt_ < 8);
		assert((bitstream->buf_ & 0xff) != 0xff);
		/* Force the pending byte of output to be written to the
		  underlying (character) stream. */
		if (jas_stream_putc(bitstream->stream_, bitstream->buf_ & 0xff) == EOF) {
			return -1;
		}
		bitstream->cnt_ = 8;
		bitstream->buf_ = (bitstream->buf_ << 8) & 0xffff;
	}

	return 0;
}